

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

bool __thiscall
ObjectModelBuilder::buildMaybeClass(ObjectModelBuilder *this,value *value,bool declaration)

{
  bool bVar1;
  object *classObject;
  ostream *poVar2;
  char *pcVar3;
  
  if (value->type_ == 5) {
    classObject = picojson::value::
                  get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                            (value);
    bVar1 = buildClass(this,classObject,declaration);
    return bVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"error: class");
  pcVar3 = "";
  if (declaration) {
    pcVar3 = " declaration";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," is not a JSON object..");
  std::endl<char,std::char_traits<char>>(poVar2);
  return false;
}

Assistant:

bool ObjectModelBuilder::buildMaybeClass(const picojson::value &value, bool declaration)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: class" << (declaration ? " declaration" : "") << " is not a JSON object.." << std::endl;
        return false;
    }
    return buildClass(value.get<picojson::object>(), declaration);
}